

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O0

int set_socket_option(int sock)

{
  int iVar1;
  undefined8 local_20;
  timeval timeout;
  int sock_local;
  
  local_20 = 10;
  timeout.tv_sec = 0;
  timeout.tv_usec._0_4_ = sock;
  if ((print_level & 1U) != 0) {
    printf("[%s][%s(%d)]:%ds %dus\n","MSG_DEBUG","set_socket_option",0x8b,10,0);
  }
  iVar1 = setsockopt((int)timeout.tv_usec,1,0x15,&local_20,0x10);
  if (iVar1 == -1) {
    if ((print_level & 4U) != 0) {
      printf("[%s][%s(%d)]:setsockopt error: %m\n","MSG_ERROR","set_socket_option",0x91);
    }
    timeout.tv_usec._4_4_ = -1;
  }
  else {
    iVar1 = setsockopt((int)timeout.tv_usec,1,0x14,&local_20,0x10);
    if (iVar1 == -1) {
      if ((print_level & 4U) != 0) {
        printf("[%s][%s(%d)]:setsockopt error: %m\n","MSG_ERROR","set_socket_option",0x98);
      }
      timeout.tv_usec._4_4_ = -1;
    }
    else {
      timeout.tv_usec._4_4_ = 0;
    }
  }
  return timeout.tv_usec._4_4_;
}

Assistant:

int set_socket_option(int sock) {
  struct timeval timeout;

  timeout.tv_sec = RCV_SND_TIMEOUT / 1000;
  timeout.tv_usec = RCV_SND_TIMEOUT % 1000 * 1000;
  lprintf(MSG_DEBUG, "%ds %dus\n", (int)timeout.tv_sec, (int)timeout.tv_usec);
  // set socket is success.

  // set send time out status
  if (-1 == setsockopt(sock, SOL_SOCKET, SO_SNDTIMEO, (char *)&timeout,
                       sizeof(struct timeval))) {
    lprintf(MSG_ERROR, "setsockopt error: %m\n");
    return -1;
  }

  // set receive time out staus
  if (-1 == setsockopt(sock, SOL_SOCKET, SO_RCVTIMEO, (char *)&timeout,
                       sizeof(struct timeval))) {
    lprintf(MSG_ERROR, "setsockopt error: %m\n");
    return -1;
  }

  return 0;
}